

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm.c
# Opt level: O0

void asm_pow(ASMState *as,IRIns *ir)

{
  IRCallID id;
  IRIns *ir_local;
  ASMState *as_local;
  
  if (((ir->field_1).t.irt & 0x1f) == 0xe) {
    if ((*(byte *)((long)as->ir + (ulong)(ir->field_0).op2 * 8 + 4) & 0x1f) == 0xe) {
      asm_callid(as,ir,IRCALL_pow);
    }
    else {
      asm_fppowi(as,ir);
    }
  }
  else {
    id = IRCALL_lj_carith_powu64;
    if (((ir->field_1).t.irt & 0x1f) == 0x15) {
      id = IRCALL_lj_carith_powi64;
    }
    asm_callid(as,ir,id);
  }
  return;
}

Assistant:

static void asm_pow(ASMState *as, IRIns *ir)
{
#if LJ_64 && LJ_HASFFI
  if (!irt_isnum(ir->t))
    asm_callid(as, ir, irt_isi64(ir->t) ? IRCALL_lj_carith_powi64 :
					  IRCALL_lj_carith_powu64);
  else
#endif
  if (irt_isnum(IR(ir->op2)->t))
    asm_callid(as, ir, IRCALL_pow);
  else
    asm_fppowi(as, ir);
}